

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Icon2.cxx
# Opt level: O3

char * get_kde_val(char *str,char *key)

{
  char cVar1;
  size_t sVar2;
  char cVar3;
  char *pcVar4;
  
  cVar1 = *str;
  cVar3 = *key;
  if (cVar1 == cVar3) {
    pcVar4 = key + 1;
    do {
      cVar1 = str[1];
      str = str + 1;
      cVar3 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar1 == cVar3);
  }
  if (cVar1 == '=' && cVar3 == '\0') {
    sVar2 = strlen(str);
    if (str[sVar2 - 1] == '\n') {
      str[sVar2 - 1] = '\0';
    }
    pcVar4 = str + 1;
  }
  else {
    pcVar4 = (char *)0x0;
  }
  return pcVar4;
}

Assistant:

static char *
get_kde_val(char       *str,
            const char *key) {
  while (*str == *key) {
    str ++;
    key ++;
  }

  if (*key == '\0' && *str == '=') {
    if (str[strlen(str) - 1] == '\n') str[strlen(str) - 1] = '\0';

    return (str + 1);
  }

  return ((char *)0);
}